

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

SrcList * sqlite3SrcListEnlarge(sqlite3 *db,SrcList *pSrc,int nExtra,int iStart)

{
  undefined1 auVar1 [16];
  int iVar2;
  uint uVar3;
  SrcList *pSVar4;
  SrcList_item *pSVar5;
  long lVar6;
  int *piVar7;
  SrcList_item *pSVar8;
  SrcList_item *pSVar9;
  SrcList_item *pSVar10;
  long lVar11;
  SrcList *pSVar12;
  long lVar13;
  byte bVar14;
  
  bVar14 = 0;
  iVar2 = pSrc->nSrc + nExtra;
  pSVar12 = pSrc;
  if (pSrc->nAlloc < iVar2) {
    pSVar4 = (SrcList *)sqlite3DbRealloc(db,pSrc,iVar2 * 0x68 + 8);
    if (pSVar4 != (SrcList *)0x0) {
      if (((db == (sqlite3 *)0x0) || (pSVar4 < (SrcList *)(db->lookaside).pStart)) ||
         ((SrcList *)(db->lookaside).pEnd <= pSVar4)) {
        uVar3 = (*sqlite3Config.m.xSize)(pSVar4);
      }
      else {
        uVar3 = (uint)(db->lookaside).sz;
      }
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (long)(int)uVar3 - 0x70;
      pSVar4->nAlloc = (short)(SUB164(auVar1 * ZEXT816(0x4ec4ec4ec4ec4ec5),8) >> 5) + 1;
      pSVar12 = pSVar4;
    }
    if (pSVar4 == (SrcList *)0x0) {
      return pSrc;
    }
  }
  lVar13 = (long)iStart;
  if (iStart < pSVar12->nSrc) {
    lVar11 = (long)(int)pSVar12->nSrc;
    pSVar5 = pSVar12->a + lVar11 + -1;
    pSVar8 = pSVar12->a + nExtra + lVar11 + -1;
    do {
      lVar11 = lVar11 + -1;
      pSVar9 = pSVar5;
      pSVar10 = pSVar8;
      for (lVar6 = 0xd; lVar6 != 0; lVar6 = lVar6 + -1) {
        pSVar10->pSchema = pSVar9->pSchema;
        pSVar9 = (SrcList_item *)((long)pSVar9 + ((ulong)bVar14 * -2 + 1) * 8);
        pSVar10 = (SrcList_item *)((long)pSVar10 + ((ulong)bVar14 * -2 + 1) * 8);
      }
      pSVar5 = pSVar5 + -1;
      pSVar8 = pSVar8 + -1;
    } while (iStart < lVar11);
  }
  pSVar12->nSrc = pSVar12->nSrc + (short)nExtra;
  memset(pSVar12->a + lVar13,0,(ulong)(uint)nExtra * 0x68);
  if (0 < nExtra) {
    piVar7 = &pSVar12->a[lVar13].iCursor;
    do {
      *piVar7 = -1;
      lVar13 = lVar13 + 1;
      piVar7 = piVar7 + 0x1a;
    } while (lVar13 < iStart + nExtra);
  }
  return pSVar12;
}

Assistant:

SQLITE_PRIVATE SrcList *sqlite3SrcListEnlarge(
  sqlite3 *db,       /* Database connection to notify of OOM errors */
  SrcList *pSrc,     /* The SrcList to be enlarged */
  int nExtra,        /* Number of new slots to add to pSrc->a[] */
  int iStart         /* Index in pSrc->a[] of first new slot */
){
  int i;

  /* Sanity checking on calling parameters */
  assert( iStart>=0 );
  assert( nExtra>=1 );
  assert( pSrc!=0 );
  assert( iStart<=pSrc->nSrc );

  /* Allocate additional space if needed */
  if( pSrc->nSrc+nExtra>pSrc->nAlloc ){
    SrcList *pNew;
    int nAlloc = pSrc->nSrc+nExtra;
    int nGot;
    pNew = sqlite3DbRealloc(db, pSrc,
               sizeof(*pSrc) + (nAlloc-1)*sizeof(pSrc->a[0]) );
    if( pNew==0 ){
      assert( db->mallocFailed );
      return pSrc;
    }
    pSrc = pNew;
    nGot = (sqlite3DbMallocSize(db, pNew) - sizeof(*pSrc))/sizeof(pSrc->a[0])+1;
    pSrc->nAlloc = (u16)nGot;
  }

  /* Move existing slots that come after the newly inserted slots
  ** out of the way */
  for(i=pSrc->nSrc-1; i>=iStart; i--){
    pSrc->a[i+nExtra] = pSrc->a[i];
  }
  pSrc->nSrc += (i16)nExtra;

  /* Zero the newly allocated slots */
  memset(&pSrc->a[iStart], 0, sizeof(pSrc->a[0])*nExtra);
  for(i=iStart; i<iStart+nExtra; i++){
    pSrc->a[i].iCursor = -1;
  }

  /* Return a pointer to the enlarged SrcList */
  return pSrc;
}